

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePart::StructOperator::Operation<duckdb::dtime_t>
               (bigint_vec *bigint_values,double_vec *double_values,dtime_t *input,idx_t idx,
               part_mask_t mask)

{
  value_type plVar1;
  value_type pdVar2;
  reference pplVar3;
  reference ppdVar4;
  int iVar5;
  long lVar6;
  vector<long_*,_std::allocator<long_*>_> local_108;
  vector<long_*,_std::allocator<long_*>_> local_f0;
  vector<long_*,_std::allocator<long_*>_> local_d8;
  vector<double_*,_std::allocator<double_*>_> local_c0;
  vector<long_*,_std::allocator<long_*>_> local_a8;
  vector<long_*,_std::allocator<long_*>_> local_90;
  vector<long_*,_std::allocator<long_*>_> local_78;
  vector<long_*,_std::allocator<long_*>_> local_60;
  vector<long_*,_std::allocator<long_*>_> local_48;
  
  if ((mask & 0x10) != 0) {
    lVar6 = input->micros;
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_48,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_48,6);
    plVar1 = *pplVar3;
    if (local_48.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lVar6 = lVar6 % 60000000;
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = lVar6;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_60,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_60,7);
    plVar1 = *pplVar3;
    if (local_60.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar5 = (int)lVar6;
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(iVar5 / 1000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_78,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_78,8);
    plVar1 = *pplVar3;
    if (local_78.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(iVar5 / 1000000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_90,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_90,9);
    plVar1 = *pplVar3;
    if (local_90.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (input->micros % 3600000000) / 60000000;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_a8,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_a8,10);
    plVar1 = *pplVar3;
    if (local_a8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = input->micros / 3600000000;
    }
  }
  if ((mask & 8) != 0) {
    ::std::vector<double_*,_std::allocator<double_*>_>::vector
              (&local_c0,&double_values->super_vector<double_*,_std::allocator<double_*>_>);
    ppdVar4 = vector<double_*,_true>::operator[]((vector<double_*,_true> *)&local_c0,0);
    pdVar2 = *ppdVar4;
    if (local_c0.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pdVar2 != (value_type)0x0) {
      pdVar2[idx] = (double)input->micros / 1000000.0;
    }
  }
  if ((mask & 0x20) != 0) {
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_d8,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_d8,0x13);
    plVar1 = *pplVar3;
    if (local_d8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = 0;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_f0,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_f0,0x14);
    plVar1 = *pplVar3;
    if (local_f0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = 0;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_108,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar3 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_108,0x15);
    plVar1 = *pplVar3;
    if (local_108.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = 0;
    }
  }
  return;
}

Assistant:

void DatePart::StructOperator::Operation(bigint_vec &bigint_values, double_vec &double_values, const dtime_t &input,
                                         const idx_t idx, const part_mask_t mask) {
	int64_t *part_data;
	if (mask & TIME) {
		const auto micros = MicrosecondsOperator::Operation<dtime_t, int64_t>(input);
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MICROSECONDS);
		if (part_data) {
			part_data[idx] = micros;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MILLISECONDS);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_MSEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::SECOND);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_SEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MINUTE);
		if (part_data) {
			part_data[idx] = MinutesOperator::Operation<dtime_t, int64_t>(input);
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::HOUR);
		if (part_data) {
			part_data[idx] = HoursOperator::Operation<dtime_t, int64_t>(input);
		}
	}

	if (mask & EPOCH) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
		if (part_data) {
			part_data[idx] = EpochOperator::Operation<dtime_t, double>(input);
		}
	}

	if (mask & ZONE) {
		part_data = HasPartValue(bigint_values, DatePartSpecifier::TIMEZONE);
		if (part_data) {
			part_data[idx] = 0;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::TIMEZONE_HOUR);
		if (part_data) {
			part_data[idx] = 0;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::TIMEZONE_MINUTE);
		if (part_data) {
			part_data[idx] = 0;
		}
	}
}